

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

bool __thiscall
libchars::command_cursor::find(command_cursor *this,string *search,filter_t mask,bool ignore_hidden)

{
  iterator *piVar1;
  char cVar2;
  bool bVar3;
  char cVar4;
  char cVar5;
  size_t sVar6;
  _Elt_pointer ppcVar7;
  _Elt_pointer ppcVar8;
  _Elt_pointer ppcVar9;
  command_node **ppcVar10;
  undefined7 in_register_00000009;
  ulong uVar11;
  command_node *local_60;
  command_node *n;
  command_cursor *local_50;
  command_node **local_48;
  undefined4 local_3c;
  ulong local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000009,ignore_hidden);
  if (search->_M_string_length != 0) {
    local_48 = &this->root;
    cVar4 = (char)this;
    local_38 = 0;
    n = (command_node *)mask;
    local_50 = this;
    do {
      ppcVar9 = (this->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppcVar7 = (this->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      ppcVar10 = local_48;
      if (ppcVar7 != ppcVar9) {
        ppcVar8 = ppcVar7;
        if (ppcVar7 ==
            (this->S).c.
            super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppcVar8 = (this->S).c.
                    super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        ppcVar10 = ppcVar8 + -1;
      }
      if ((*ppcVar10 == (command_node *)0x0) || (search->_M_string_length <= local_38)) {
        if (ppcVar7 == ppcVar9) {
          ppcVar10 = &this->root;
        }
        else {
          ppcVar8 = ppcVar7;
          if (ppcVar7 ==
              (this->S).c.
              super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppcVar8 = (this->S).c.
                      super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          ppcVar10 = ppcVar8 + -1;
        }
        if (*ppcVar10 == (command_node *)0x0) {
          return (bool)0;
        }
        if (local_38 < search->_M_string_length) {
          return (bool)0;
        }
        if (ppcVar7 == ppcVar9) {
          ppcVar10 = &this->root;
        }
        else {
          ppcVar8 = ppcVar7;
          if (ppcVar7 ==
              (this->S).c.
              super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppcVar8 = (this->S).c.
                      super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          ppcVar10 = ppcVar8 + -1;
        }
        if (((*ppcVar10)->mask & (ulong)n) == 0) {
          return (bool)0;
        }
        if (ppcVar7 == ppcVar9) {
          ppcVar10 = &this->root;
        }
        else {
          if (ppcVar7 ==
              (this->S).c.
              super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppcVar7 = (this->S).c.
                      super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          ppcVar10 = ppcVar7 + -1;
        }
        return (bool)((*ppcVar10)->hidden ^ 1U | (byte)local_3c);
      }
      cVar2 = (search->_M_dataplus)._M_p[local_38];
      uVar11 = this->idx;
      sVar6 = current_length(this);
      if (uVar11 < sVar6) {
        cVar5 = current_char(this);
        if (cVar2 == cVar5) {
          ppcVar9 = (this->S).c.
                    super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur;
          ppcVar7 = (this->S).c.
                    super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          ppcVar10 = local_48;
          if (ppcVar7 != ppcVar9) {
            ppcVar8 = ppcVar7;
            if (ppcVar7 ==
                (this->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppcVar8 = (this->S).c.
                        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
            }
            ppcVar10 = ppcVar8 + -1;
          }
          if (((*ppcVar10)->mask & (ulong)n) == 0) goto LAB_0010b853;
          ppcVar10 = local_48;
          if (ppcVar7 != ppcVar9) {
            if (ppcVar7 ==
                (this->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppcVar7 = (this->S).c.
                        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
            }
            ppcVar10 = ppcVar7 + -1;
          }
          if ((byte)((*ppcVar10)->hidden ^ 1U | (byte)local_3c) != 1) goto LAB_0010b853;
          uVar11 = local_38 + 1;
          this->idx = this->idx + 1;
          std::__cxx11::string::push_back(cVar4 + 'P');
          local_38 = uVar11;
          this = local_50;
LAB_0010b8fb:
          bVar3 = true;
        }
        else {
LAB_0010b853:
          if ((this->idx == 0) &&
             (ppcVar9 = (this->S).c.
                        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur,
             ppcVar9 !=
             (this->S).c.
             super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur)) {
            if (ppcVar9 ==
                (this->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppcVar9 = (this->S).c.
                        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
            }
            local_60 = ppcVar9[-1]->next;
            if (local_60 != (command_node *)0x0) {
              std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>::
              pop_back((deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_> *
                       )this);
              ppcVar9 = (local_50->S).c.
                        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (ppcVar9 ==
                  (local_50->S).c.
                  super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<libchars::command_node*,std::allocator<libchars::command_node*>>::
                _M_push_back_aux<libchars::command_node*const&>
                          ((deque<libchars::command_node*,std::allocator<libchars::command_node*>> *
                           )local_50,&local_60);
                this = local_50;
              }
              else {
                *ppcVar9 = local_60;
                piVar1 = &(local_50->S).c.
                          super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                          ._M_impl.super__Deque_impl_data._M_finish;
                piVar1->_M_cur = piVar1->_M_cur + 1;
                this = local_50;
              }
              goto LAB_0010b8f0;
            }
          }
          bVar3 = false;
        }
      }
      else {
        ppcVar10 = local_48;
        if (ppcVar7 != ppcVar9) {
          ppcVar8 = ppcVar7;
          if (ppcVar7 ==
              (this->S).c.
              super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppcVar8 = (this->S).c.
                      super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          ppcVar10 = ppcVar8 + -1;
        }
        if ((*ppcVar10)->head != (command_node *)0x0) {
          ppcVar10 = local_48;
          if (ppcVar7 != ppcVar9) {
            ppcVar8 = ppcVar7;
            if (ppcVar7 ==
                (this->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppcVar8 = (this->S).c.
                        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
            }
            ppcVar10 = ppcVar8 + -1;
          }
          if (((*ppcVar10)->mask & (ulong)n) == 0) goto LAB_0010b868;
          ppcVar10 = local_48;
          if (ppcVar7 != ppcVar9) {
            ppcVar8 = ppcVar7;
            if (ppcVar7 ==
                (this->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppcVar8 = (this->S).c.
                        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
            }
            ppcVar10 = ppcVar8 + -1;
          }
          if ((byte)((*ppcVar10)->hidden ^ 1U | (byte)local_3c) != 1) goto LAB_0010b868;
          ppcVar10 = local_48;
          if (ppcVar7 != ppcVar9) {
            ppcVar9 = ppcVar7;
            if (ppcVar7 ==
                (this->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppcVar9 = (this->S).c.
                        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
            }
            ppcVar10 = ppcVar9 + -1;
          }
          if (ppcVar7 ==
              (this->S).c.
              super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<libchars::command_node*,std::allocator<libchars::command_node*>>::
            _M_push_back_aux<libchars::command_node*const&>
                      ((deque<libchars::command_node*,std::allocator<libchars::command_node*>> *)
                       this,&(*ppcVar10)->head);
            this = local_50;
          }
          else {
            *ppcVar7 = (*ppcVar10)->head;
            piVar1 = &(this->S).c.
                      super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish;
            piVar1->_M_cur = piVar1->_M_cur + 1;
          }
LAB_0010b8f0:
          this->idx = 0;
          goto LAB_0010b8fb;
        }
LAB_0010b868:
        bVar3 = false;
      }
    } while (bVar3);
  }
  return false;
}

Assistant:

bool command_cursor::find(const std::string &search, command::filter_t mask, bool ignore_hidden)
    {
        if (search.empty())
            return false;

        size_t si = 0; // index into search (0..length)

        while (current() != NULL && si < search.length()) {
            char c = search.at(si);

            if (idx >= current_length()) {
                if (current()->head != NULL && (current()->mask & mask) != 0 && (!current()->hidden || ignore_hidden)) {
                    S.push(current()->head);
                    idx = 0;
                }
                else {
                    return false;
                }
            }
            else if (c == current_char() && (current()->mask & mask) != 0 && (!current()->hidden || ignore_hidden)) {
                ++si;
                ++idx;
                w += c;
            }
            else if (idx == 0) {
                if (S.empty()) {
                    return false;
                }
                command_node *n = S.top()->next;
                if (n != NULL) {
                    S.pop();
                    S.push(n);
                    idx = 0;
                }
                else {
                    return false;
                }
            }
            else {
                return false;
            }
        }

        return (current() != NULL && si >= search.length() && (current()->mask & mask) != 0 && (!current()->hidden || ignore_hidden));
    }